

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O0

void freeResults(dotNode *(*results) [7])

{
  dotNode_t *pdVar1;
  dotNode *next;
  dotNode *node;
  int j;
  int i;
  dotNode *(*results_local) [7];
  
  for (node._4_4_ = 0; node._4_4_ < 0x72; node._4_4_ = node._4_4_ + 1) {
    for (node._0_4_ = 0; (int)node < 7; node._0_4_ = (int)node + 1) {
      next = results[node._4_4_][(int)node];
      while (next != (dotNode *)0x0) {
        pdVar1 = next->next;
        free(next);
        next = pdVar1;
      }
      results[node._4_4_][(int)node] = (dotNode *)0x0;
    }
  }
  return;
}

Assistant:

void freeResults(dotNode *results[][NODEWIDTH])
{
   int i, j;
   dotNode *node, *next;

   for (i = 0; i < NUMATOMTYPES; i++) {
      for (j = 0; j < NODEWIDTH; j++) {
	 for (node = results[i][j]; node; node = next) {
	    next = node->next;
	    free(node);
	 }
	 results[i][j] = NULL;
      }
   }
}